

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O1

bool __thiscall cmCTestRunTest::StartAgain(cmCTestRunTest *this,size_t completed)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  cmWorkingDirectory workdir;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  cmWorkingDirectory local_48;
  
  bVar1 = this->RunAgain;
  if (bVar1 == true) {
    this->RunAgain = false;
    cmWorkingDirectory::cmWorkingDirectory(&local_48,&this->TestProperties->Directory);
    if (local_48.ResultCode == 0) {
      StartTest(this,completed,this->TotalNumberOfTests);
    }
    else {
      std::operator+(&local_68,"Failed to change working directory to ",
                     &this->TestProperties->Directory);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_68);
      plVar3 = plVar2 + 2;
      if ((long *)*plVar2 == plVar3) {
        local_98 = *plVar3;
        lStack_90 = plVar2[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar3;
        local_a8 = (long *)*plVar2;
      }
      local_a0 = plVar2[1];
      *plVar2 = (long)plVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      strerror(local_48.ResultCode);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_88.field_2._M_allocated_capacity = *psVar4;
        local_88.field_2._8_8_ = plVar2[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar4;
        local_88._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_88._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      StartFailure(this,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    cmWorkingDirectory::~cmWorkingDirectory(&local_48);
  }
  return bVar1;
}

Assistant:

bool cmCTestRunTest::StartAgain(size_t completed)
{
  if (!this->RunAgain) {
    return false;
  }
  this->RunAgain = false; // reset
  // change to tests directory
  cmWorkingDirectory workdir(this->TestProperties->Directory);
  if (workdir.Failed()) {
    this->StartFailure("Failed to change working directory to " +
                       this->TestProperties->Directory + " : " +
                       std::strerror(workdir.GetLastResult()));
    return true;
  }

  this->StartTest(completed, this->TotalNumberOfTests);
  return true;
}